

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_192_192_30_3(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t *in_stack_ffffffffffffffe0;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x7bb57df7,in_stack_ffffffffffffffe0,(uint8_t *)0x0,
                    (uint8_t *)0x0);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_30_3(void) {
  const uint8_t key[24] = {0xF7, 0x7D, 0xB5, 0x7B, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[24]           = {0xB5, 0xDF, 0x53, 0x7B, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[24] = {0xE4, 0x82, 0xBC, 0xF9, 0xAD, 0x2C, 0x04, 0x48,
                                           0x31, 0x48, 0xD4, 0x6F, 0xBE, 0x1F, 0x8B, 0x51,
                                           0x46, 0x0D, 0xCC, 0x3E, 0x8E, 0xFB, 0x31, 0x01};

  return lowmc_enc(&parameters_192_192_30, key, plaintext, ciphertext_expected);
}